

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

void xmlXPathCompEqualityExpr(xmlXPathParserContextPtr ctxt)

{
  int ch1;
  byte *pbVar1;
  byte *pbVar2;
  char cVar3;
  ulong uVar4;
  
  xmlXPathCompRelationalExpr(ctxt);
  if (ctxt->error == 0) {
    pbVar1 = ctxt->cur;
    while ((uVar4 = (ulong)*pbVar1, uVar4 < 0x21 && ((0x100002600U >> (uVar4 & 0x3f) & 1) != 0))) {
      pbVar1 = pbVar1 + 1;
      ctxt->cur = pbVar1;
    }
    while ((cVar3 = (char)uVar4, cVar3 == '=' || (((int)uVar4 == 0x21 && (pbVar1[1] == 0x3d))))) {
      ch1 = ctxt->comp->last;
      pbVar2 = pbVar1 + 1;
      ctxt->cur = pbVar2;
      if (cVar3 == '=') goto LAB_001b64b9;
      if (*pbVar2 == 0) goto LAB_001b64b9;
      pbVar2 = pbVar1 + 2;
      while( true ) {
        ctxt->cur = pbVar2;
LAB_001b64b9:
        if ((0x20 < (ulong)*pbVar2) || ((0x100002600U >> ((ulong)*pbVar2 & 0x3f) & 1) == 0)) break;
        pbVar2 = pbVar2 + 1;
      }
      xmlXPathCompRelationalExpr(ctxt);
      if (ctxt->error != 0) {
        return;
      }
      xmlXPathCompExprAdd(ctxt,ch1,ctxt->comp->last,XPATH_OP_EQUAL,(uint)(cVar3 == '='),0,0,
                          (void *)0x0,(void *)0x0);
      pbVar1 = ctxt->cur;
      while ((uVar4 = (ulong)*pbVar1, uVar4 < 0x21 && ((0x100002600U >> (uVar4 & 0x3f) & 1) != 0)))
      {
        pbVar1 = pbVar1 + 1;
        ctxt->cur = pbVar1;
      }
    }
  }
  return;
}

Assistant:

static void
xmlXPathCompEqualityExpr(xmlXPathParserContextPtr ctxt) {
    xmlXPathCompRelationalExpr(ctxt);
    CHECK_ERROR;
    SKIP_BLANKS;
    while ((CUR == '=') || ((CUR == '!') && (NXT(1) == '='))) {
	int eq;
	int op1 = ctxt->comp->last;

        if (CUR == '=') eq = 1;
	else eq = 0;
	NEXT;
	if (!eq) NEXT;
	SKIP_BLANKS;
        xmlXPathCompRelationalExpr(ctxt);
	CHECK_ERROR;
	PUSH_BINARY_EXPR(XPATH_OP_EQUAL, op1, ctxt->comp->last, eq, 0);
	SKIP_BLANKS;
    }
}